

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
insert_key_range_internal
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  value_view v;
  size_type sVar1;
  const_reference pvVar2;
  ulong local_30;
  key_type key;
  bool bypass_verifier_local;
  size_t count_local;
  key_type start_key_local;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  for (local_30 = start_key; local_30 < start_key + count; local_30 = local_30 + 1) {
    sVar1 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::size
                      ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)test_values
                      );
    pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                       ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                        test_values,local_30 % sVar1);
    v._M_ptr = pvVar2->_M_ptr;
    v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
    insert<unsigned_long>(this,local_30,v,bypass_verifier);
  }
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }